

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser * init_parse_mon_base(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_mon_base_name);
  parser_reg(p,"glyph char glyph",parse_mon_base_glyph);
  parser_reg(p,"pain uint pain",parse_mon_base_pain);
  parser_reg(p,"flags ?str flags",parse_mon_base_flags);
  parser_reg(p,"desc str desc",parse_mon_base_desc);
  return p;
}

Assistant:

static struct parser *init_parse_mon_base(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);

	parser_reg(p, "name str name", parse_mon_base_name);
	parser_reg(p, "glyph char glyph", parse_mon_base_glyph);
	parser_reg(p, "pain uint pain", parse_mon_base_pain);
	parser_reg(p, "flags ?str flags", parse_mon_base_flags);
	parser_reg(p, "desc str desc", parse_mon_base_desc);
	return p;
}